

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7a016f::HandleJSONCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *arguments,cmExecutionStatus *status)

{
  optional<(anonymous_namespace)::Args> errorPath_00;
  optional<(anonymous_namespace)::Args> errorPath_01;
  optional<(anonymous_namespace)::Args> errorPath_02;
  optional<(anonymous_namespace)::Args> errorPath_03;
  optional<(anonymous_namespace)::Args> errorPath_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_03;
  bool bVar2;
  ArrayIndex AVar3;
  uint max;
  ValueType VVar4;
  reference this;
  string *psVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  string *key;
  Value *pVVar8;
  json_error *pjVar9;
  Value *extraout_RDX;
  Value *extraout_RDX_00;
  Value *extraout_RDX_01;
  Value *extraout_RDX_02;
  Value *extraout_RDX_03;
  Value *extraout_RDX_04;
  Value *extraout_RDX_05;
  string_view sVar10;
  basic_string_view<char,_std::char_traits<char>_> bVar11;
  const_iterator cVar12;
  ValueConstIterator VVar13;
  Args path;
  Args path_00;
  Args path_01;
  Args path_02;
  Args path_03;
  Args path_04;
  bool local_cc1;
  bool local_c42;
  string errorPath;
  json_error *e;
  Value json2;
  string *jsonstr2;
  string local_a48;
  string_view local_a28;
  _Storage<(anonymous_namespace)::Args,_true> local_a10;
  undefined8 local_a00;
  string_view local_9f8;
  string_view local_9e8;
  string_view local_9d8;
  iterator local_9c8;
  size_type local_9c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_9a8;
  Args local_9a0;
  optional<(anonymous_namespace)::Args> local_990;
  ArrayIndex local_974;
  undefined1 local_970 [4];
  int index_2;
  Value newValue;
  Value *value_5;
  string *toAdd;
  string *newValueStr;
  string local_8a0;
  string_view local_880;
  _Storage<(anonymous_namespace)::Args,_true> local_870;
  undefined8 local_860;
  string_view local_858;
  string_view local_848;
  string_view local_838;
  iterator local_820;
  size_type local_818;
  undefined1 local_810 [8];
  Value removed_1;
  Value removed;
  Args local_7a8;
  optional<(anonymous_namespace)::Args> local_798;
  ArrayIndex local_77c;
  Value *pVStack_778;
  int index_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_770;
  Value *local_760;
  Value *value_4;
  char *pcStack_750;
  Value *local_748;
  char *pcStack_740;
  string *local_738;
  string *toRemove;
  char *local_728;
  string *local_720;
  char *local_718;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_710;
  string_view local_700;
  undefined1 local_6f0 [8];
  cmAlphaNum sizeStr;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  string_view local_698;
  string_view local_688;
  iterator local_678;
  size_type local_670;
  Value *local_668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_660;
  Value *local_650;
  Value *value_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_640;
  Value *local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_630;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_628;
  String local_618;
  string_view local_5f8;
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  _Base_ptr local_5d8;
  undefined1 local_5d0;
  _Base_ptr local_5c8;
  undefined4 local_5c0;
  undefined1 local_5b8 [8];
  ValueConstIterator memIt;
  Args local_590;
  optional<(anonymous_namespace)::Args> local_580;
  difference_type local_564;
  undefined1 auStack_560 [4];
  int index;
  undefined8 uStack_558;
  bool local_550;
  undefined7 uStack_54f;
  string_view local_548;
  string_view local_538;
  string_view local_528;
  iterator local_518;
  size_type local_510;
  Value *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_500;
  Value *local_4f0;
  Value *value_2;
  char *pcStack_4e0;
  Value *local_4d8;
  char *pcStack_4d0;
  string *local_4c0;
  string *indexStr;
  char *local_4b0;
  string *local_4a8;
  char *local_4a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_498;
  string_view local_488;
  Value *local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_470;
  Value *local_460;
  Value *value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  Value *local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_440;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_438;
  String local_428;
  string_view local_408;
  string local_3f8;
  string_view local_3d8;
  Value *local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_3c0;
  Value *local_3b8;
  Value *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  Value *local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_398;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_390;
  undefined1 local_380 [8];
  Value json;
  string *jsonstr;
  _Storage<(anonymous_namespace)::Args,_true> local_320;
  undefined8 local_310;
  string_view local_308;
  string_view local_2f8;
  string_view local_2e8;
  undefined1 local_2d8 [16];
  undefined4 local_2c8;
  undefined4 uStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  iterator local_2b8;
  size_type local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  basic_string_view<char,_std::char_traits<char>_> local_298;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_258;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1b8;
  basic_string_view<char,_std::char_traits<char>_> local_1a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_198;
  basic_string_view<char,_std::char_traits<char>_> local_188;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_168;
  string_view local_158;
  string_view local_148;
  string *local_130;
  string *mode;
  char *pcStack_120;
  string *local_118;
  char *pcStack_110;
  string_view local_108;
  string_view local_f8;
  string_view local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_a8;
  string_view local_88;
  string_view local_78;
  byte local_59;
  string *psStack_58;
  bool success;
  string *outputVariable;
  string *errorVariable;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  undefined1 auStack_30 [8];
  Args args;
  cmMakefile *makefile;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  args.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmExecutionStatus::GetMakefile(status);
  local_40._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(arguments);
  local_38 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator+(&local_40,1);
  errorVariable =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(arguments);
  Args::cmRange((Args *)auStack_30,local_38,
                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )errorVariable);
  outputVariable = (string *)0x0;
  psStack_58 = (string *)0x0;
  local_59 = 1;
  local_88 = (string_view)::cm::operator____s("missing out-var argument",0x18);
  local_78 = local_88;
  psStack_58 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_88);
  bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)auStack_30);
  local_c42 = false;
  if (!bVar2) {
    local_b0 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)auStack_30);
    this = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_b0);
    local_a8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    local_d0 = (basic_string_view<char,_std::char_traits<char>_>)
               ::cm::operator____s("ERROR_VARIABLE",0xe);
    local_c0 = local_d0;
    local_c42 = std::operator==(local_a8,local_d0);
  }
  if (local_c42 != false) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"");
    (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_e0);
    local_108 = (string_view)::cm::operator____s("missing error-var argument",0x1a);
    local_f8 = local_108;
    psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_108);
    _Var6 = args.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    outputVariable = psVar5;
    sVar10 = (string_view)::cm::operator____s("NOTFOUND",8);
    pcStack_120 = sVar10._M_str;
    mode = (string *)sVar10._M_len;
    local_118 = mode;
    pcStack_110 = pcStack_120;
    cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,sVar10);
  }
  local_158 = (string_view)::cm::operator____s("missing mode argument",0x15);
  local_148 = local_158;
  local_130 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,local_158);
  local_168 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
  local_188 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("GET",3);
  local_178 = local_188;
  bVar2 = std::operator!=(local_168,local_188);
  local_cc1 = false;
  if (bVar2) {
    local_198 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    local_1b8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("TYPE",4);
    local_1a8 = local_1b8;
    bVar2 = std::operator!=(local_198,local_1b8);
    local_cc1 = false;
    if (bVar2) {
      local_1c8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      local_1e8 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MEMBER",6);
      local_1d8 = local_1e8;
      bVar2 = std::operator!=(local_1c8,local_1e8);
      local_cc1 = false;
      if (bVar2) {
        local_1f8 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
        local_218 = (basic_string_view<char,_std::char_traits<char>_>)
                    ::cm::operator____s("LENGTH",6);
        local_208 = local_218;
        bVar2 = std::operator!=(local_1f8,local_218);
        local_cc1 = false;
        if (bVar2) {
          local_228 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
          local_248 = (basic_string_view<char,_std::char_traits<char>_>)
                      ::cm::operator____s("REMOVE",6);
          local_238 = local_248;
          bVar2 = std::operator!=(local_228,local_248);
          local_cc1 = false;
          if (bVar2) {
            local_258 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)local_130);
            local_278 = (basic_string_view<char,_std::char_traits<char>_>)
                        ::cm::operator____s("SET",3);
            local_268 = local_278;
            bVar2 = std::operator!=(local_258,local_278);
            local_cc1 = false;
            if (bVar2) {
              local_288 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)local_130);
              local_2a8 = (basic_string_view<char,_std::char_traits<char>_>)
                          ::cm::operator____s("EQUAL",5);
              local_298 = local_2a8;
              local_cc1 = std::operator!=(local_288,local_2a8);
            }
          }
        }
      }
    }
  }
  if (local_cc1 != false) {
    pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
    local_2f8 = (string_view)::cm::operator____s("got an invalid mode \'",0x15);
    local_2e8 = local_2f8;
    local_2d8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    local_308 = (string_view)
                ::cm::operator____s("\', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET,  EQUAL"
                                    ,0x41);
    local_2c8 = (undefined4)local_308._M_len;
    uStack_2c4 = local_308._M_len._4_4_;
    uStack_2c0 = local_308._M_str._0_4_;
    uStack_2bc = local_308._M_str._4_4_;
    local_2b8 = &local_2e8;
    local_2b0 = 3;
    std::optional<(anonymous_namespace)::Args>::optional
              ((optional<(anonymous_namespace)::Args> *)&local_320);
    message_03._M_len = local_2b0;
    message_03._M_array = local_2b8;
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .End._M_current =
         local_320._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .Begin._M_current =
         local_320._M_value.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .Begin._M_current;
    errorPath_00.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
    super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_310;
    json_error::json_error(pjVar9,message_03,errorPath_00);
    __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  sVar10 = (string_view)::cm::operator____s("missing json string argument",0x1c);
  json.limit_ = sVar10._M_len;
  psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,sVar10);
  ReadJson((Value *)local_380,psVar5);
  local_390 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
  bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("GET",3);
  _Var6._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
  value = (Value *)bVar11._M_len;
  local_3a8 = _Var6._M_current;
  local_3a0 = value;
  local_398 = _Var6._M_current;
  bVar2 = std::operator==(local_390,bVar11);
  if (!bVar2) {
    local_438 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
    bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("TYPE",4);
    _Var6._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
    value_1 = (Value *)bVar11._M_len;
    local_450 = _Var6._M_current;
    local_448 = value_1;
    local_440 = _Var6._M_current;
    bVar2 = std::operator==(local_438,bVar11);
    if (bVar2) {
      local_478 = (Value *)auStack_30;
      pbStack_470 = args.
                    super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .Begin._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .End._M_current = _Var6._M_current;
      path_00.
      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      .Begin._M_current =
           args.
           super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           .Begin._M_current;
      local_460 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,path_00);
      _Var6 = args.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End;
      psVar5 = psStack_58;
      VVar4 = Json::Value::type(local_460);
      local_488 = JsonTypeToString(VVar4);
      cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_488);
    }
    else {
      local_498 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
      bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("MEMBER",6);
      local_4b0 = bVar11._M_str;
      indexStr = (string *)bVar11._M_len;
      local_4a8 = indexStr;
      local_4a0 = local_4b0;
      bVar2 = std::operator==(local_498,bVar11);
      if (bVar2) {
        sVar10 = (string_view)::cm::operator____s("missing member index",0x14);
        pcStack_4e0 = sVar10._M_str;
        _Var6._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_len;
        value_2 = (Value *)_Var6._M_current;
        local_4d8 = (Value *)_Var6._M_current;
        pcStack_4d0 = pcStack_4e0;
        local_4c0 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
        local_508 = (Value *)auStack_30;
        pbStack_500 = args.
                      super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .Begin._M_current;
        path_01.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .End._M_current = _Var6._M_current;
        path_01.
        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .Begin._M_current =
             args.
             super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             .Begin._M_current;
        local_4f0 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,path_01);
        bVar2 = Json::Value::isObject(local_4f0);
        psVar5 = local_4c0;
        if (!bVar2) {
          pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
          local_548 = (string_view)
                      ::cm::operator____s("MEMBER needs to be called with an element of type OBJECT, got "
                                          ,0x3e);
          local_538 = local_548;
          VVar4 = Json::Value::type(local_4f0);
          local_528 = JsonTypeToString(VVar4);
          local_518 = &local_538;
          local_510 = 2;
          std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args_&,_true>
                    ((optional<(anonymous_namespace)::Args> *)auStack_560,(Args *)auStack_30);
          message_02._M_len = local_510;
          message_02._M_array = local_518;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )uStack_558;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )_auStack_560;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._M_engaged = local_550;
          errorPath_01.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
          super__Optional_payload_base<(anonymous_namespace)::Args>._17_7_ = uStack_54f;
          json_error::json_error(pjVar9,message_02,errorPath_01);
          __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
        }
        _Var6 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)auStack_30);
        memIt.super_ValueIteratorBase._8_8_ =
             cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)auStack_30);
        _Var7 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator+((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&memIt.super_ValueIteratorBase.isNull_,1);
        Args::cmRange(&local_590,_Var6,_Var7);
        std::optional<(anonymous_namespace)::Args>::optional<(anonymous_namespace)::Args,_true>
                  (&local_580,&local_590);
        AVar3 = Json::Value::size(local_4f0);
        local_564 = ParseIndex(psVar5,&local_580,AVar3);
        cVar12 = Json::Value::begin(local_4f0);
        local_5d8 = (_Base_ptr)cVar12.super_ValueIteratorBase.current_._M_node;
        local_5d0 = cVar12.super_ValueIteratorBase.isNull_;
        local_5c0 = CONCAT31(local_5c0._1_3_,local_5d0);
        VVar13.super_ValueIteratorBase._8_4_ = local_5c0;
        VVar13.super_ValueIteratorBase.current_._M_node = local_5d8;
        VVar13.super_ValueIteratorBase._12_4_ = 0;
        local_5c8 = local_5d8;
        VVar13 = std::next<Json::ValueConstIterator>(VVar13,local_564);
        _Var6 = args.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End;
        psVar5 = psStack_58;
        local_5e8 = (_Base_ptr)VVar13.super_ValueIteratorBase.current_._M_node;
        local_5e0 = VVar13.super_ValueIteratorBase.isNull_;
        local_5b8 = (undefined1  [8])local_5e8;
        memIt.super_ValueIteratorBase.current_._M_node._0_1_ = local_5e0;
        Json::ValueIteratorBase::name_abi_cxx11_(&local_618,(ValueIteratorBase *)local_5b8);
        local_5f8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_618);
        cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_5f8);
        std::__cxx11::string::~string((string *)&local_618);
      }
      else {
        local_628 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
        bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("LENGTH",6);
        _Var6._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar11._M_str;
        value_3 = (Value *)bVar11._M_len;
        local_640 = _Var6._M_current;
        local_638 = value_3;
        local_630 = _Var6._M_current;
        bVar2 = std::operator==(local_628,bVar11);
        if (bVar2) {
          local_668 = (Value *)auStack_30;
          pbStack_660 = args.
                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .Begin._M_current;
          path_02.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .End._M_current = _Var6._M_current;
          path_02.
          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .Begin._M_current =
               args.
               super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .Begin._M_current;
          local_650 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,path_02
                                 );
          bVar2 = Json::Value::isArray(local_650);
          if (!bVar2) {
            bVar2 = Json::Value::isObject(local_650);
            if (!bVar2) {
              pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
              local_698 = (string_view)
                          ::cm::operator____s("LENGTH needs to be called with an element of type ARRAY or OBJECT, got "
                                              ,0x47);
              VVar4 = Json::Value::type(local_650);
              local_688 = JsonTypeToString(VVar4);
              local_678 = &local_698;
              local_670 = 2;
              std::optional<(anonymous_namespace)::Args>::
              optional<(anonymous_namespace)::Args_&,_true>
                        ((optional<(anonymous_namespace)::Args> *)(sizeStr.Digits_ + 0x18),
                         (Args *)auStack_30);
              message_01._M_len = local_670;
              message_01._M_array = local_678;
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End._M_current =
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )uStack_6b8;
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload._M_value.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin._M_current =
                   (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )sizeStr.Digits_._24_8_;
              errorPath_02.super__Optional_base<(anonymous_namespace)::Args,_true,_true>._M_payload.
              super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ = local_6b0;
              json_error::json_error(pjVar9,message_01,errorPath_02);
              __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                          json_error::~json_error);
            }
          }
          AVar3 = Json::Value::size(local_650);
          cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_6f0,AVar3);
          _Var6 = args.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End;
          psVar5 = psStack_58;
          local_700 = cmAlphaNum::View((cmAlphaNum *)local_6f0);
          cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_700);
        }
        else {
          local_710 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
          bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("REMOVE",6)
          ;
          local_728 = bVar11._M_str;
          toRemove = (string *)bVar11._M_len;
          local_720 = toRemove;
          local_718 = local_728;
          bVar2 = std::operator==(local_710,bVar11);
          if (bVar2) {
            sVar10 = (string_view)::cm::operator____s("missing member or index to remove",0x21);
            pcStack_750 = sVar10._M_str;
            _Var6._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar10._M_len;
            value_4 = (Value *)_Var6._M_current;
            local_748 = (Value *)_Var6._M_current;
            pcStack_740 = pcStack_750;
            local_738 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
            pVStack_778 = (Value *)auStack_30;
            pbStack_770 = args.
                          super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .Begin._M_current;
            path_03.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End._M_current = _Var6._M_current;
            path_03.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .Begin._M_current =
                 args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .Begin._M_current;
            local_760 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,
                                    path_03);
            bVar2 = Json::Value::isArray(local_760);
            psVar5 = local_738;
            if (bVar2) {
              _Var6 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)auStack_30);
              removed.limit_ =
                   (ptrdiff_t)
                   cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)auStack_30);
              _Var7 = __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator+((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&removed.limit_,1);
              Args::cmRange(&local_7a8,_Var6,_Var7);
              std::optional<(anonymous_namespace)::Args>::
              optional<(anonymous_namespace)::Args,_true>(&local_798,&local_7a8);
              AVar3 = Json::Value::size(local_760);
              local_77c = ParseIndex(psVar5,&local_798,AVar3);
              Json::Value::Value((Value *)&removed_1.limit_,nullValue);
              Json::Value::removeIndex(local_760,local_77c,(Value *)&removed_1.limit_);
              Json::Value::~Value((Value *)&removed_1.limit_);
              pVVar8 = extraout_RDX_01;
            }
            else {
              bVar2 = Json::Value::isObject(local_760);
              if (!bVar2) {
                pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
                local_858 = (string_view)
                            ::cm::operator____s("REMOVE needs to be called with an element of type ARRAY or OBJECT, got "
                                                ,0x47);
                local_848 = local_858;
                VVar4 = Json::Value::type(local_760);
                local_838 = JsonTypeToString(VVar4);
                local_820 = &local_848;
                local_818 = 2;
                std::optional<(anonymous_namespace)::Args>::
                optional<(anonymous_namespace)::Args_&,_true>
                          ((optional<(anonymous_namespace)::Args> *)&local_870._M_value,
                           (Args *)auStack_30);
                message_00._M_len = local_818;
                message_00._M_array = local_820;
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                _M_value.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .End._M_current =
                     local_870._M_value.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .End._M_current;
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                _M_value.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .Begin._M_current =
                     local_870._M_value.
                     super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     .Begin._M_current;
                errorPath_03.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ =
                     local_860;
                json_error::json_error(pjVar9,message_00,errorPath_03);
                __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                            json_error::~json_error);
              }
              Json::Value::Value((Value *)local_810,nullValue);
              Json::Value::removeMember(local_760,local_738,(Value *)local_810);
              Json::Value::~Value((Value *)local_810);
              pVVar8 = extraout_RDX_02;
            }
            _Var6._M_current =
                 args.
                 super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 .End._M_current;
            psVar5 = psStack_58;
            (anonymous_namespace)::WriteJson_abi_cxx11_
                      (&local_8a0,(_anonymous_namespace_ *)local_380,pVVar8);
            local_880 = (string_view)
                        std::__cxx11::string::operator_cast_to_basic_string_view
                                  ((string *)&local_8a0);
            cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_880);
            std::__cxx11::string::~string((string *)&local_8a0);
          }
          else {
            _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
            bVar11 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("SET",3);
            bVar2 = std::operator==(_Var1,bVar11);
            if (bVar2) {
              sVar10 = (string_view)::cm::operator____s("missing new value remove",0x18);
              psVar5 = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
              sVar10 = (string_view)::cm::operator____s("missing member name to add",0x1a);
              _Var6._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   sVar10._M_len;
              key = (anonymous_namespace)::Args::PopBack_abi_cxx11_((Args *)auStack_30,sVar10);
              newValue.limit_ = (ptrdiff_t)auStack_30;
              path_04.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .End._M_current = _Var6._M_current;
              path_04.
              super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              .Begin._M_current =
                   args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .Begin._M_current;
              pVVar8 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,
                                   path_04);
              ReadJson((Value *)local_970,psVar5);
              bVar2 = Json::Value::isObject(pVVar8);
              if (bVar2) {
                pVVar8 = Json::Value::operator[](pVVar8,key);
                Json::Value::operator=(pVVar8,(Value *)local_970);
                pVVar8 = extraout_RDX_03;
              }
              else {
                bVar2 = Json::Value::isArray(pVVar8);
                if (!bVar2) {
                  pjVar9 = (json_error *)__cxa_allocate_exception(0x28);
                  local_9f8 = (string_view)
                              ::cm::operator____s("SET needs to be called with an element of type OBJECT or ARRAY, got "
                                                  ,0x44);
                  local_9e8 = local_9f8;
                  VVar4 = Json::Value::type(pVVar8);
                  local_9d8 = JsonTypeToString(VVar4);
                  local_9c8 = &local_9e8;
                  local_9c0 = 2;
                  std::optional<(anonymous_namespace)::Args>::optional
                            ((optional<(anonymous_namespace)::Args> *)&local_a10);
                  message._M_len = local_9c0;
                  message._M_array = local_9c8;
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                  _M_value.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .End._M_current =
                       local_a10._M_value.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .End._M_current;
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._M_payload.
                  _M_value.
                  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .Begin._M_current =
                       local_a10._M_value.
                       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .Begin._M_current;
                  errorPath_04.super__Optional_base<(anonymous_namespace)::Args,_true,_true>.
                  _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>._16_8_ =
                       local_a00;
                  json_error::json_error(pjVar9,message,errorPath_04);
                  __cxa_throw(pjVar9,&(anonymous_namespace)::json_error::typeinfo,
                              json_error::~json_error);
                }
                local_9a8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)auStack_30);
                local_9b8 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   *)auStack_30);
                local_9b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator+(&local_9b8,1);
                Args::cmRange(&local_9a0,local_9a8,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_9b0);
                std::optional<(anonymous_namespace)::Args>::
                optional<(anonymous_namespace)::Args,_true>(&local_990,&local_9a0);
                max = std::numeric_limits<unsigned_int>::max();
                local_974 = ParseIndex(key,&local_990,max);
                bVar2 = Json::Value::isValidIndex(pVVar8,local_974);
                if (bVar2) {
                  pVVar8 = Json::Value::operator[](pVVar8,local_974);
                  Json::Value::operator=(pVVar8,(Value *)local_970);
                  pVVar8 = extraout_RDX_04;
                }
                else {
                  Json::Value::append(pVVar8,(Value *)local_970);
                  pVVar8 = extraout_RDX_05;
                }
              }
              _Var6._M_current =
                   args.
                   super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   .End._M_current;
              psVar5 = psStack_58;
              (anonymous_namespace)::WriteJson_abi_cxx11_
                        (&local_a48,(_anonymous_namespace_ *)local_380,pVVar8);
              local_a28 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_a48);
              cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_a28);
              std::__cxx11::string::~string((string *)&local_a48);
              Json::Value::~Value((Value *)local_970);
            }
            else {
              _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                      std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_130);
              bVar11 = (basic_string_view<char,_std::char_traits<char>_>)
                       ::cm::operator____s("EQUAL",5);
              bVar2 = std::operator==(_Var1,bVar11);
              if (bVar2) {
                sVar10 = (string_view)
                         ::cm::operator____s("missing second json string argument",0x23);
                json2.limit_ = sVar10._M_len;
                psVar5 = (anonymous_namespace)::Args::PopFront_abi_cxx11_((Args *)auStack_30,sVar10)
                ;
                ReadJson((Value *)&e,psVar5);
                _Var6 = args.
                        super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        .End;
                psVar5 = psStack_58;
                bVar2 = Json::Value::operator==((Value *)local_380,(Value *)&e);
                cmMakefile::AddDefinitionBool((cmMakefile *)_Var6._M_current,psVar5,bVar2);
                Json::Value::~Value((Value *)&e);
              }
            }
          }
        }
      }
    }
    goto LAB_00485fbf;
  }
  local_3c8 = (Value *)auStack_30;
  pbStack_3c0 = args.
                super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                .Begin._M_current;
  path.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .End._M_current = _Var6._M_current;
  path.
  super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .Begin._M_current =
       args.
       super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       .Begin._M_current;
  local_3b8 = ResolvePath((anon_unknown_dwarf_7a016f *)local_380,(Value *)auStack_30,path);
  bVar2 = Json::Value::isObject(local_3b8);
  pVVar8 = extraout_RDX;
  if (bVar2) {
LAB_00484838:
    _Var6._M_current =
         args.
         super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         .End._M_current;
    psVar5 = psStack_58;
    (anonymous_namespace)::WriteJson_abi_cxx11_
              (&local_3f8,(_anonymous_namespace_ *)local_3b8,pVVar8);
    local_3d8 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3f8);
    cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
  }
  else {
    bVar2 = Json::Value::isArray(local_3b8);
    pVVar8 = extraout_RDX_00;
    if (bVar2) goto LAB_00484838;
    bVar2 = Json::Value::isBool(local_3b8);
    _Var6 = args.
            super_cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .End;
    psVar5 = psStack_58;
    if (bVar2) {
      bVar2 = Json::Value::asBool(local_3b8);
      cmMakefile::AddDefinitionBool((cmMakefile *)_Var6._M_current,psVar5,bVar2);
    }
    else {
      Json::Value::asString_abi_cxx11_(&local_428,local_3b8);
      local_408 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_428);
      cmMakefile::AddDefinition((cmMakefile *)_Var6._M_current,psVar5,local_408);
      std::__cxx11::string::~string((string *)&local_428);
    }
  }
LAB_00485fbf:
  Json::Value::~Value((Value *)local_380);
  return (bool)(local_59 & 1);
}

Assistant:

bool HandleJSONCommand(std::vector<std::string> const& arguments,
                       cmExecutionStatus& status)
{
#if !defined(CMAKE_BOOTSTRAP)

  auto& makefile = status.GetMakefile();
  Args args{ arguments.begin() + 1, arguments.end() };

  const std::string* errorVariable = nullptr;
  const std::string* outputVariable = nullptr;
  bool success = true;

  try {
    outputVariable = &args.PopFront("missing out-var argument"_s);

    if (!args.empty() && *args.begin() == "ERROR_VARIABLE"_s) {
      args.PopFront("");
      errorVariable = &args.PopFront("missing error-var argument"_s);
      makefile.AddDefinition(*errorVariable, "NOTFOUND"_s);
    }

    const auto& mode = args.PopFront("missing mode argument"_s);
    if (mode != "GET"_s && mode != "TYPE"_s && mode != "MEMBER"_s &&
        mode != "LENGTH"_s && mode != "REMOVE"_s && mode != "SET"_s &&
        mode != "EQUAL"_s) {
      throw json_error(
        { "got an invalid mode '"_s, mode,
          "', expected one of GET, TYPE, MEMBER, LENGTH, REMOVE, SET, "
          " EQUAL"_s });
    }

    const auto& jsonstr = args.PopFront("missing json string argument"_s);
    Json::Value json = ReadJson(jsonstr);

    if (mode == "GET"_s) {
      const auto& value = ResolvePath(json, args);
      if (value.isObject() || value.isArray()) {
        makefile.AddDefinition(*outputVariable, WriteJson(value));
      } else if (value.isBool()) {
        makefile.AddDefinitionBool(*outputVariable, value.asBool());
      } else {
        makefile.AddDefinition(*outputVariable, value.asString());
      }

    } else if (mode == "TYPE"_s) {
      const auto& value = ResolvePath(json, args);
      makefile.AddDefinition(*outputVariable, JsonTypeToString(value.type()));

    } else if (mode == "MEMBER"_s) {
      const auto& indexStr = args.PopBack("missing member index"_s);
      const auto& value = ResolvePath(json, args);
      if (!value.isObject()) {
        throw json_error({ "MEMBER needs to be called with an element of "
                           "type OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      const auto index = ParseIndex(
        indexStr, Args{ args.begin(), args.end() + 1 }, value.size());
      const auto memIt = std::next(value.begin(), index);
      makefile.AddDefinition(*outputVariable, memIt.name());

    } else if (mode == "LENGTH"_s) {
      const auto& value = ResolvePath(json, args);
      if (!value.isArray() && !value.isObject()) {
        throw json_error({ "LENGTH needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }

      cmAlphaNum sizeStr{ value.size() };
      makefile.AddDefinition(*outputVariable, sizeStr.View());

    } else if (mode == "REMOVE"_s) {
      const auto& toRemove =
        args.PopBack("missing member or index to remove"_s);
      auto& value = ResolvePath(json, args);

      if (value.isArray()) {
        const auto index = ParseIndex(
          toRemove, Args{ args.begin(), args.end() + 1 }, value.size());
        Json::Value removed;
        value.removeIndex(index, &removed);

      } else if (value.isObject()) {
        Json::Value removed;
        value.removeMember(toRemove, &removed);

      } else {
        throw json_error({ "REMOVE needs to be called with an "
                           "element of type ARRAY or OBJECT, got "_s,
                           JsonTypeToString(value.type()) },
                         args);
      }
      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "SET"_s) {
      const auto& newValueStr = args.PopBack("missing new value remove"_s);
      const auto& toAdd = args.PopBack("missing member name to add"_s);
      auto& value = ResolvePath(json, args);

      Json::Value newValue = ReadJson(newValueStr);
      if (value.isObject()) {
        value[toAdd] = newValue;
      } else if (value.isArray()) {
        const auto index =
          ParseIndex(toAdd, Args{ args.begin(), args.end() + 1 });
        if (value.isValidIndex(index)) {
          value[static_cast<int>(index)] = newValue;
        } else {
          value.append(newValue);
        }
      } else {
        throw json_error({ "SET needs to be called with an "
                           "element of type OBJECT or ARRAY, got "_s,
                           JsonTypeToString(value.type()) });
      }

      makefile.AddDefinition(*outputVariable, WriteJson(json));

    } else if (mode == "EQUAL"_s) {
      const auto& jsonstr2 =
        args.PopFront("missing second json string argument"_s);
      Json::Value json2 = ReadJson(jsonstr2);
      makefile.AddDefinitionBool(*outputVariable, json == json2);
    }

  } catch (const json_error& e) {
    if (outputVariable && e.ErrorPath) {
      const auto errorPath = cmJoin(*e.ErrorPath, "-");
      makefile.AddDefinition(*outputVariable,
                             cmCatViews({ errorPath, "-NOTFOUND"_s }));
    } else if (outputVariable) {
      makefile.AddDefinition(*outputVariable, "NOTFOUND"_s);
    }

    if (errorVariable) {
      makefile.AddDefinition(*errorVariable, e.what());
    } else {
      status.SetError(cmCatViews({ "sub-command JSON "_s, e.what(), "."_s }));
      success = false;
    }
  }
  return success;
#else
  status.SetError(cmStrCat(arguments[0], " not available during bootstrap"_s));
  return false;
#endif
}